

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O0

bool __thiscall
wasm::DAE::refineArgumentTypes
          (DAE *this,Function *func,vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *calls,
          Module *module,DAEFunctionInfo *info)

{
  allocator<wasm::LUBFinder> *this_00;
  pointer __n;
  bool bVar1;
  reference this_01;
  reference ppCVar2;
  Expression **ppEVar3;
  Type local_f0;
  Type local_e8;
  Type newParams;
  Type local_d0;
  uintptr_t local_c8;
  Expression *local_c0;
  Expression *operand;
  Call *call;
  const_iterator __end3;
  const_iterator __begin3;
  vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *__range3;
  value_type *lub;
  Type originalType;
  Index i;
  vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_> lubs;
  undefined1 local_58 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> newParamTypes;
  size_t numParams;
  DAEFunctionInfo *info_local;
  Module *module_local;
  vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *calls_local;
  Function *func_local;
  DAE *this_local;
  
  bVar1 = FeatureSet::hasGC(&module->features);
  if (bVar1) {
    newParamTypes.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)Function::getNumParams(func);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_58);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::reserve
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_58,
               (size_type)
               newParamTypes.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    __n = newParamTypes.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
    this_00 = (allocator<wasm::LUBFinder> *)((long)&originalType.id + 7);
    std::allocator<wasm::LUBFinder>::allocator(this_00);
    std::vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>::vector
              ((vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_> *)&i,(size_type)__n,
               this_00);
    std::allocator<wasm::LUBFinder>::~allocator
              ((allocator<wasm::LUBFinder> *)((long)&originalType.id + 7));
    for (originalType.id._0_4_ = 0;
        (pointer)(ulong)(uint)originalType.id <
        newParamTypes.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage; originalType.id._0_4_ = (uint)originalType.id + 1
        ) {
      lub = (value_type *)Function::getLocalType(func,(uint)originalType.id);
      bVar1 = wasm::Type::isRef((Type *)&lub);
      if ((!bVar1) || (bVar1 = SortedVector::has(&info->unusedParams,(uint)originalType.id), bVar1))
      {
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_58,(value_type *)&lub);
      }
      else {
        this_01 = std::vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>::operator[]
                            ((vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_> *)&i,
                             (ulong)(uint)originalType.id);
        __end3 = std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::begin(calls);
        call = (Call *)std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::end(calls);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<wasm::Call_*const_*,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                                           *)&call), bVar1) {
          ppCVar2 = __gnu_cxx::
                    __normal_iterator<wasm::Call_*const_*,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                    ::operator*(&__end3);
          operand = (Expression *)*ppCVar2;
          ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (&(((Call *)operand)->operands).
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ,(ulong)(uint)originalType.id);
          local_c0 = *ppEVar3;
          local_c8 = (local_c0->type).id;
          LUBFinder::note(this_01,(Type)local_c8);
          local_d0 = LUBFinder::getLUB(this_01);
          bVar1 = wasm::Type::operator==(&local_d0,(Type *)&lub);
          if (bVar1) break;
          __gnu_cxx::
          __normal_iterator<wasm::Call_*const_*,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
          ::operator++(&__end3);
        }
        bVar1 = LUBFinder::noted(this_01);
        if (!bVar1) {
          this_local._7_1_ = false;
          goto LAB_01bcd530;
        }
        newParams = LUBFinder::getLUB(this_01);
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_58,&newParams);
      }
    }
    wasm::Type::Type(&local_e8,(Tuple *)local_58);
    local_f0 = Function::getParams(func);
    bVar1 = wasm::Type::operator==(&local_e8,&local_f0);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      TypeUpdating::updateParamTypes
                (func,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_58,module,Update);
      Function::setParams(func,local_e8);
      this_local._7_1_ = true;
    }
LAB_01bcd530:
    std::vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>::~vector
              ((vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_> *)&i);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_58);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool refineArgumentTypes(Function* func,
                           const std::vector<Call*>& calls,
                           Module* module,
                           const DAEFunctionInfo& info) {
    if (!module->features.hasGC()) {
      return false;
    }
    auto numParams = func->getNumParams();
    std::vector<Type> newParamTypes;
    newParamTypes.reserve(numParams);
    std::vector<LUBFinder> lubs(numParams);
    for (Index i = 0; i < numParams; i++) {
      auto originalType = func->getLocalType(i);
      // If the parameter type is not a reference, there is nothing to refine.
      // And if it is unused, also do nothing, as we can leave it to the other
      // parts of this pass to optimize it properly, which avoids having to
      // think about corner cases involving refining the type of an unused
      // param (in particular, unused params are turned into locals, which means
      // we'd need to think about defaultability etc.).
      if (!originalType.isRef() || info.unusedParams.has(i)) {
        newParamTypes.push_back(originalType);
        continue;
      }
      auto& lub = lubs[i];
      for (auto* call : calls) {
        auto* operand = call->operands[i];
        lub.note(operand->type);
        if (lub.getLUB() == originalType) {
          // We failed to refine this parameter to anything more specific.
          break;
        }
      }

      // Nothing is sent here at all; leave such optimizations to DCE.
      if (!lub.noted()) {
        return false;
      }
      newParamTypes.push_back(lub.getLUB());
    }

    // Check if we are able to optimize here before we do the work to scan the
    // function body.
    auto newParams = Type(newParamTypes);
    if (newParams == func->getParams()) {
      return false;
    }

    // We can do this!
    TypeUpdating::updateParamTypes(func, newParamTypes, *module);

    // Update the function's type.
    func->setParams(newParams);

    return true;
  }